

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void ArrayInitEx(array *p,cc_memheap *Heap)

{
  cc_memheap *pcVar1;
  
  if (Heap == (cc_memheap *)0x0) {
    pcVar1 = (cc_memheap *)0x0;
  }
  else {
    if (-1 < (long)Heap->Size) {
      __assert_fail("Heap->Size & DATA_FLAG_MEMHEAP",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x85,"void ArrayInitEx(array *, const cc_memheap *)");
    }
    pcVar1 = Heap + 1;
  }
  p->_Begin = (char *)pcVar1;
  p->_Used = 0;
  return;
}

Assistant:

void ArrayInitEx(array* p,const cc_memheap* Heap)
{
    if (Heap == NULL)
        p->_Begin = NULL;
    else
    {
        assert(Heap->Size & DATA_FLAG_MEMHEAP);
        p->_Begin = (void*)Heap->data;
    }
    p->_Used = 0;
}